

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_highbd_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  char in_SIL;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint m_7;
  int diff_7;
  int j_7;
  int i_7;
  uint m_6;
  int diff_6;
  int j_6;
  int i_6;
  uint bd_shift_1;
  uint m_5;
  int diff_5;
  int j_5;
  int i_5;
  uint m_4;
  int diff_4;
  int j_4;
  int i_4;
  uint m_3;
  int diff_3;
  int j_3;
  int i_3;
  uint m_2;
  int diff_2;
  int j_2;
  int i_2;
  uint bd_shift;
  uint m_1;
  int diff_1;
  int j_1;
  int i_1;
  uint m;
  int diff;
  int j;
  int i;
  undefined4 local_14c;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_138;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_8;
  
  if (in_SIL == '\0') {
    local_18 = in_RDX << 1;
    local_28 = in_R8 << 1;
    local_8 = in_RDI;
    if (in_stack_00000018 == 8) {
      for (local_4c = 0; local_4c < in_stack_00000008; local_4c = local_4c + 1) {
        for (local_50 = 0; local_50 < in_stack_00000010; local_50 = local_50 + 1) {
          iVar1 = (uint)*(ushort *)(local_18 + (long)local_50 * 2) -
                  (uint)*(ushort *)(local_28 + (long)local_50 * 2);
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_138 = negative_to_zero(iVar1 / 0x10 + 0x26);
          if (0x3f < local_138) {
            local_138 = 0x40;
          }
          *(char *)(local_8 + local_50) = (char)local_138;
        }
        local_18 = local_18 + (long)in_ECX * 2;
        local_28 = local_28 + (long)in_R9D * 2;
        local_8 = local_8 + in_stack_00000010;
      }
    }
    else {
      for (local_70 = 0; local_70 < in_stack_00000008; local_70 = local_70 + 1) {
        for (local_74 = 0; local_74 < in_stack_00000010; local_74 = local_74 + 1) {
          iVar1 = (uint)*(ushort *)(local_18 + (long)local_74 * 2) -
                  (uint)*(ushort *)(local_28 + (long)local_74 * 2);
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_140 = negative_to_zero((iVar1 >> ((char)in_stack_00000018 - 8U & 0x1f)) / 0x10 +
                                       0x26);
          if (0x3f < local_140) {
            local_140 = 0x40;
          }
          *(char *)(local_8 + local_74) = (char)local_140;
        }
        local_18 = local_18 + (long)in_ECX * 2;
        local_28 = local_28 + (long)in_R9D * 2;
        local_8 = local_8 + in_stack_00000010;
      }
    }
  }
  else if (in_SIL == '\x01') {
    local_98 = in_RDX << 1;
    local_a8 = in_R8 << 1;
    local_88 = in_RDI;
    if (in_stack_00000018 == 8) {
      for (local_bc = 0; local_bc < in_stack_00000008; local_bc = local_bc + 1) {
        for (local_c0 = 0; local_c0 < in_stack_00000010; local_c0 = local_c0 + 1) {
          iVar1 = (uint)*(ushort *)(local_98 + (long)local_c0 * 2) -
                  (uint)*(ushort *)(local_a8 + (long)local_c0 * 2);
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_144 = negative_to_zero(iVar1 / 0x10 + 0x26);
          if (0x3f < local_144) {
            local_144 = 0x40;
          }
          *(char *)(local_88 + local_c0) = '@' - (char)local_144;
        }
        local_98 = local_98 + (long)in_ECX * 2;
        local_a8 = local_a8 + (long)in_R9D * 2;
        local_88 = local_88 + in_stack_00000010;
      }
    }
    else {
      for (local_e0 = 0; local_e0 < in_stack_00000008; local_e0 = local_e0 + 1) {
        for (local_e4 = 0; local_e4 < in_stack_00000010; local_e4 = local_e4 + 1) {
          iVar1 = (uint)*(ushort *)(local_98 + (long)local_e4 * 2) -
                  (uint)*(ushort *)(local_a8 + (long)local_e4 * 2);
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_14c = negative_to_zero((iVar1 >> ((char)in_stack_00000018 - 8U & 0x1f)) / 0x10 +
                                       0x26);
          if (0x3f < local_14c) {
            local_14c = 0x40;
          }
          *(char *)(local_88 + local_e4) = '@' - (char)local_14c;
        }
        local_98 = local_98 + (long)in_ECX * 2;
        local_a8 = local_a8 + (long)in_R9D * 2;
        local_88 = local_88 + in_stack_00000010;
      }
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_c(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask_highbd(mask, 0, 38, CONVERT_TO_SHORTPTR(src0), src0_stride,
                          CONVERT_TO_SHORTPTR(src1), src1_stride, h, w, bd);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask_highbd(mask, 1, 38, CONVERT_TO_SHORTPTR(src0), src0_stride,
                          CONVERT_TO_SHORTPTR(src1), src1_stride, h, w, bd);
      break;
    default: assert(0);
  }
}